

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall InsertProxyModel::itemData(InsertProxyModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  RolesContainer *pRVar8;
  const_reference other;
  QModelIndex *in_RDX;
  int local_124;
  bool local_103;
  bool local_102;
  bool local_101;
  bool local_e9;
  int sectionIdx;
  undefined1 local_b0 [24];
  Int local_98;
  bool local_91;
  Int local_90;
  bool isExtraCol;
  QFlags<InsertProxyModel::InsertDirection> local_88;
  QFlags<InsertProxyModel::InsertDirection> QStack_84;
  bool isExtraRow;
  QModelIndex local_80;
  InsertProxyModelPrivate *local_68;
  InsertProxyModelPrivate *d;
  int local_44;
  int sourceCols;
  int local_24;
  QModelIndex *pQStack_20;
  int sourceRows;
  QModelIndex *index_local;
  InsertProxyModel *this_local;
  
  pQStack_20 = in_RDX;
  index_local = index;
  this_local = this;
  bVar1 = QModelIndex::isValid(in_RDX);
  if (!bVar1) {
    memset(this,0,8);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this);
    return (QMap<int,_QVariant>)
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
  }
  lVar5 = QAbstractProxyModel::sourceModel();
  if (lVar5 == 0) {
    memset(this,0,8);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this);
    return (QMap<int,_QVariant>)
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
  }
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffc0);
  local_24 = (**(code **)(*plVar6 + 0x78))(plVar6,&stack0xffffffffffffffc0);
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex((QModelIndex *)&d);
  local_44 = (**(code **)(*plVar6 + 0x80))(plVar6,&d);
  local_68 = d_func((InsertProxyModel *)index);
  QModelIndex::parent(&local_80,pQStack_20);
  bVar1 = QModelIndex::isValid(&local_80);
  local_e9 = true;
  if (!bVar1) {
    iVar2 = QModelIndex::row(pQStack_20);
    local_e9 = true;
    if (iVar2 <= local_24) {
      iVar2 = QModelIndex::column(pQStack_20);
      local_e9 = true;
      if (iVar2 <= local_44) {
        iVar2 = QModelIndex::row(pQStack_20);
        if (iVar2 == local_24) {
          QStack_84 = QFlags<InsertProxyModel::InsertDirection>::operator&
                                (&local_68->m_insertDirection,InsertRow);
          bVar1 = QFlags<InsertProxyModel::InsertDirection>::operator!(&stack0xffffffffffffff7c);
          local_e9 = true;
          if (bVar1) goto LAB_00184815;
        }
        iVar2 = QModelIndex::column(pQStack_20);
        local_101 = false;
        if (iVar2 == local_44) {
          local_88 = QFlags<InsertProxyModel::InsertDirection>::operator&
                               (&local_68->m_insertDirection,InsertColumn);
          local_101 = QFlags<InsertProxyModel::InsertDirection>::operator!(&local_88);
        }
        local_e9 = local_101;
      }
    }
  }
LAB_00184815:
  if (local_e9 == false) {
    iVar2 = QModelIndex::row(pQStack_20);
    local_102 = false;
    if (iVar2 == local_24) {
      local_90 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                (&local_68->m_insertDirection,InsertRow);
      IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_90);
      local_102 = IVar3 != 0;
    }
    isExtraCol = local_102;
    iVar2 = QModelIndex::column(pQStack_20);
    local_103 = false;
    if (iVar2 == local_44) {
      local_98 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                (&local_68->m_insertDirection,InsertColumn);
      IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_98);
      local_103 = IVar3 != 0;
    }
    local_91 = local_103;
    if (((isExtraCol & 1U) == 0) && (local_103 == false)) {
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      iVar2 = QModelIndex::row(pQStack_20);
      iVar4 = QModelIndex::column(pQStack_20);
      QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff38);
      (**(code **)(*plVar7 + 0x60))(local_b0,plVar7,iVar2,iVar4,&stack0xffffffffffffff38);
      (**(code **)(*plVar6 + 0xb0))(this,plVar6,local_b0);
    }
    else if (((isExtraCol & 1U) == 0) || (local_103 == false)) {
      if ((isExtraCol & 1U) == 0) {
        local_124 = QModelIndex::row(pQStack_20);
      }
      else {
        local_124 = QModelIndex::column(pQStack_20);
      }
      other = QList<QMap<int,_QVariant>_>::operator[]
                        (local_68->m_extraData + (isExtraCol & 1),(long)local_124);
      pRVar8 = convertFromContainer<QMap<int,QVariant>,void>(other);
      QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this,pRVar8);
    }
    else {
      pRVar8 = convertFromContainer<QMap<int,QVariant>,void>(&local_68->m_dataForCorner);
      QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this,pRVar8);
    }
  }
  else {
    memset(this,0,8);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this);
  }
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> InsertProxyModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid())
        return QMap<int, QVariant>();
    if (!sourceModel())
        return QMap<int, QVariant>();
    const int sourceRows = sourceModel()->rowCount();
    const int sourceCols = sourceModel()->columnCount();
    Q_D(const InsertProxyModel);
    if (index.parent().isValid() || index.row() > sourceRows || index.column() > sourceCols
        || (index.row() == sourceRows && !(d->m_insertDirection & InsertRow))
        || (index.column() == sourceCols && !(d->m_insertDirection & InsertColumn)))
        return QMap<int, QVariant>();
    const bool isExtraRow = index.row() == sourceRows && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceCols && d->m_insertDirection & InsertColumn;
    if (!(isExtraRow || isExtraCol))
        return sourceModel()->itemData(sourceModel()->index(index.row(), index.column()));
    if (isExtraRow && isExtraCol)
        return convertFromContainer<QMap<int, QVariant>>(d->m_dataForCorner);
    const int sectionIdx = isExtraRow ? index.column() : index.row();
    return convertFromContainer<QMap<int, QVariant>>(d->m_extraData[isExtraRow][sectionIdx]);
}